

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inja.hpp
# Opt level: O0

bool __thiscall inja::Parser::parse_expression_and(Parser *this,Template *tmpl)

{
  basic_string_view<char,_std::char_traits<char>_> lhs;
  bool bVar1;
  bool local_49;
  type local_40;
  const_pointer local_30;
  size_type local_28;
  Template *local_20;
  Template *tmpl_local;
  Parser *this_local;
  
  local_20 = tmpl;
  tmpl_local = (Template *)this;
  bVar1 = parse_expression_not(this,tmpl);
  if (bVar1) {
    local_49 = true;
    if ((this->m_tok).kind == Id) {
      local_30 = (this->m_tok).text.data_;
      local_28 = (this->m_tok).text.size_;
      nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_40,"and");
      lhs.size_ = local_28;
      lhs.data_ = local_30;
      local_49 = nonstd::sv_lite::operator!=(lhs,local_40);
    }
    if (local_49 == false) {
      get_next_token(this);
      bVar1 = parse_expression_not(this,local_20);
      if (bVar1) {
        append_function(this,local_20,And,2);
        this_local._7_1_ = true;
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = true;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool parse_expression_and(Template& tmpl) {
		if (!parse_expression_not(tmpl)) return false;
		if (m_tok.kind != Token::Kind::Id || m_tok.text != "and") return true;
		get_next_token();
		if (!parse_expression_not(tmpl)) return false;
		append_function(tmpl, Bytecode::Op::And, 2);
		return true;
	}